

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_NewAtomString(JSContext *ctx,char *str)

{
  JSAtom atom_00;
  JSContext *in_RSI;
  char *in_RDI;
  JSAtom atom;
  JSValue val;
  JSValue local_10;
  undefined8 uStack_8;
  
  atom_00 = JS_NewAtom((JSContext *)local_10.u.ptr,in_RDI);
  if (atom_00 == 0) {
    local_10.u.ptr = (void *)(local_10._4_8_ << 0x20);
    uStack_8 = 6;
  }
  else {
    local_10 = JS_AtomToString(in_RSI,atom_00);
    JS_FreeAtom(in_RSI,atom_00);
  }
  return local_10;
}

Assistant:

JSValue JS_NewAtomString(JSContext *ctx, const char *str)
{
    JSAtom atom = JS_NewAtom(ctx, str);
    if (atom == JS_ATOM_NULL)
        return JS_EXCEPTION;
    JSValue val = JS_AtomToString(ctx, atom);
    JS_FreeAtom(ctx, atom);
    return val;
}